

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_maps.cpp
# Opt level: O0

bool polyscope::render::buildColormapSelector(string *cm,string *fieldName)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pVVar2;
  undefined8 in_RSI;
  string *in_RDI;
  unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
  *c;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>
  *__range3;
  bool changed;
  char *in_stack_00000068;
  ImGuiComboFlags in_stack_0000015c;
  char *in_stack_00000160;
  char *in_stack_00000168;
  vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  ImVec2 in_stack_ffffffffffffffc0;
  __normal_iterator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_*,_std::vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>_>
  local_28;
  long local_20;
  byte local_11;
  string *local_8;
  
  local_11 = 0;
  local_8 = in_RDI;
  ImGui::PushItemWidth((float)((ulong)in_RSI >> 0x20));
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  bVar1 = ImGui::BeginCombo(in_stack_00000168,in_stack_00000160,in_stack_0000015c);
  if (bVar1) {
    local_20 = engine + 0x208;
    local_28._M_current =
         (unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
          *)std::
            vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>
            ::begin(in_stack_ffffffffffffff98);
    std::
    vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>
    ::end(in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_*,_std::vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                              (__normal_iterator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_*,_std::vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_*,_std::vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>_>
      ::operator*(&local_28);
      std::
      unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
      ::operator->((unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
                    *)0x3786ea);
      std::__cxx11::string::c_str();
      std::
      unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
      ::operator->((unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
                    *)0x378701);
      in_stack_ffffffffffffffa7 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffffc0,__rhs);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,0.0,0.0);
      bVar1 = ImGui::Selectable(in_stack_00000068,cm._7_1_,(ImGuiSelectableFlags)cm,
                                (ImVec2 *)fieldName);
      if (bVar1) {
        local_11 = 1;
        pVVar2 = std::
                 unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
                 ::operator->((unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>
                               *)0x378754);
        std::__cxx11::string::operator=(local_8,(string *)pVVar2);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_*,_std::vector<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>,_std::allocator<std::unique_ptr<polyscope::render::ValueColorMap,_std::default_delete<polyscope::render::ValueColorMap>_>_>_>_>
      ::operator++(&local_28);
    }
    ImGui::EndCombo();
  }
  ImGui::PopItemWidth();
  return (bool)(local_11 & 1);
}

Assistant:

bool buildColormapSelector(std::string& cm, std::string fieldName) {
  bool changed = false;

  ImGui::PushItemWidth(100);

  if (ImGui::BeginCombo(fieldName.c_str(), cm.c_str())) {
    for (auto& c : render::engine->colorMaps) {
      if (ImGui::Selectable(c->name.c_str(), c->name == cm)) {
        changed = true;
        cm = c->name;
      }
    }
    ImGui::EndCombo();
  }

  ImGui::PopItemWidth();

  return changed;
}